

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::ColumnFetchState::GetOrInsertHandle(ColumnFetchState *this,ColumnSegment *segment)

{
  BlockHandle *pBVar1;
  _Node_iterator_base<std::pair<const_long,_duckdb::BufferHandle>,_false> _Var2;
  BufferManager *pBVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_duckdb::BufferHandle>,_false,_false>,_bool>
  pVar4;
  block_id_t primary_id;
  BufferHandle handle;
  block_id_t local_60;
  BufferHandle local_58;
  block_id_t local_40;
  BufferHandle local_38;
  
  pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  local_60 = pBVar1->block_id;
  _Var2._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_60);
  if (_Var2._M_cur == (__node_type *)0x0) {
    pBVar3 = BufferManager::GetBufferManager(segment->db);
    (*pBVar3->_vptr_BufferManager[7])(&local_58,pBVar3,&segment->block);
    local_40 = local_60;
    BufferHandle::BufferHandle(&local_38,&local_58);
    pVar4 = ::std::
            _Hashtable<long,std::pair<long_const,duckdb::BufferHandle>,std::allocator<std::pair<long_const,duckdb::BufferHandle>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<long,duckdb::BufferHandle>>
                      ((_Hashtable<long,std::pair<long_const,duckdb::BufferHandle>,std::allocator<std::pair<long_const,duckdb::BufferHandle>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this,&local_40);
    _Var2._M_cur = (__node_type *)
                   pVar4.first.
                   super__Node_iterator_base<std::pair<const_long,_duckdb::BufferHandle>,_false>.
                   _M_cur;
    BufferHandle::~BufferHandle(&local_38);
    BufferHandle::~BufferHandle(&local_58);
  }
  return (BufferHandle *)
         ((long)&((_Var2._M_cur)->
                 super__Hash_node_value<std::pair<const_long,_duckdb::BufferHandle>,_false>).
                 super__Hash_node_value_base<std::pair<const_long,_duckdb::BufferHandle>_>.
                 _M_storage._M_storage + 8);
}

Assistant:

BufferHandle &ColumnFetchState::GetOrInsertHandle(ColumnSegment &segment) {
	auto primary_id = segment.block->BlockId();

	auto entry = handles.find(primary_id);
	if (entry == handles.end()) {
		// not pinned yet: pin it
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		auto handle = buffer_manager.Pin(segment.block);
		auto pinned_entry = handles.insert(make_pair(primary_id, std::move(handle)));
		return pinned_entry.first->second;
	} else {
		// already pinned: use the pinned handle
		return entry->second;
	}
}